

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O2

size_t __thiscall
std::hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::operator()
          (hash<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *this,
          AlgebraicExpression<mp::QuadAndLinTerms> *x)

{
  size_t sVar1;
  hash<mp::QuadAndLinTerms> local_11;
  double local_10;
  
  sVar1 = hash<mp::QuadAndLinTerms>::operator()(&local_11,&x->super_QuadAndLinTerms);
  local_10 = x->constant_term_;
  sVar1 = mp::internal::HashCombine<double>(sVar1 + 0x9e3779b9,&local_10);
  return sVar1;
}

Assistant:

size_t operator()(
      const mp::AlgebraicExpression<Body>& x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Body>{}(x.GetBody()));
    hs.Add(x.constant_term());
    return hs.FinalizeHashValue();
  }